

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

l_mem singlestep(lua_State *L,int fast)

{
  global_State *g;
  GCObject *o;
  l_mem lVar1;
  GCObject **nextlist;
  long lVar2;
  lu_byte nextstate;
  long lVar3;
  l_mem lStack_20;
  
  g = L->l_G;
  g->gcstopem = '\x01';
  lStack_20 = 0;
  switch(g->gcstate) {
  case '\0':
    if ((fast != 0) || (g->gray == (GCObject *)0x0)) {
      g->gcstate = '\x01';
      goto LAB_0010cadf;
    }
    lStack_20 = propagatemark(g);
    break;
  case '\x01':
    atomic(L);
    if (g->gckind == '\x02') {
      lVar3 = g->GCtotalbytes - g->GCdebt;
      lVar1 = luaO_applyparam(g->gcparams[1],lVar3 - g->GCmajorminor);
      lVar2 = g->GCmarked;
      if (lVar1 < lVar3 - lVar2) {
        atomic2gen(L,g);
        setminordebt(g);
        lStack_20 = -1;
        break;
      }
    }
    else {
      lVar2 = g->GCmarked;
    }
    g->GCmajorminor = lVar2;
    entersweep(L);
    lStack_20 = -2;
    break;
  default:
    goto switchD_0010c9e2_caseD_2;
  case '\x03':
    nextlist = &g->finobj;
    nextstate = '\x04';
    goto LAB_0010cb0b;
  case '\x04':
    nextlist = &g->tobefnz;
    nextstate = '\x05';
    goto LAB_0010cb0b;
  case '\x05':
    nextstate = '\x06';
    nextlist = (GCObject **)0x0;
LAB_0010cb0b:
    sweepstep(L,g,nextstate,nextlist,fast);
LAB_0010cb10:
    lStack_20 = 0x14;
    break;
  case '\x06':
    checkSizes(L,g);
    g->gcstate = '\a';
    goto LAB_0010cb10;
  case '\a':
    if ((g->tobefnz == (GCObject *)0x0) || (g->gcemergency != '\0')) {
      g->gcstate = '\b';
      lStack_20 = -3;
    }
    else {
      g->gcstopem = '\0';
      GCTM(L);
      lStack_20 = 10;
    }
    break;
  case '\b':
    g->weak = (GCObject *)0x0;
    g->ephemeron = (GCObject *)0x0;
    g->allweak = (GCObject *)0x0;
    g->gray = (GCObject *)0x0;
    g->grayagain = (GCObject *)0x0;
    g->GCmarked = 0;
    if (((g->mainth).l.marked & 0x18) != 0) {
      reallymarkobject(g,(GCObject *)&(g->mainth).l);
    }
    if ((((g->l_registry).tt_ & 0x40) != 0) &&
       (o = (g->l_registry).value_.gc, (o->marked & 0x18) != 0)) {
      reallymarkobject(g,o);
    }
    markmt(g);
    markbeingfnz(g);
    g->gcstate = '\0';
LAB_0010cadf:
    lStack_20 = 1;
  }
  g->gcstopem = '\0';
switchD_0010c9e2_caseD_2:
  return lStack_20;
}

Assistant:

static l_mem singlestep (lua_State *L, int fast) {
  global_State *g = G(L);
  l_mem stepresult;
  lua_assert(!g->gcstopem);  /* collector is not reentrant */
  g->gcstopem = 1;  /* no emergency collections while collecting */
  switch (g->gcstate) {
    case GCSpause: {
      restartcollection(g);
      g->gcstate = GCSpropagate;
      stepresult = 1;
      break;
    }
    case GCSpropagate: {
      if (fast || g->gray == NULL) {
        g->gcstate = GCSenteratomic;  /* finish propagate phase */
        stepresult = 1;
      }
      else
        stepresult = propagatemark(g);  /* traverse one gray object */
      break;
    }
    case GCSenteratomic: {
      atomic(L);
      if (checkmajorminor(L, g))
        stepresult = step2minor;
      else {
        entersweep(L);
        stepresult = atomicstep;
      }
      break;
    }
    case GCSswpallgc: {  /* sweep "regular" objects */
      sweepstep(L, g, GCSswpfinobj, &g->finobj, fast);
      stepresult = GCSWEEPMAX;
      break;
    }
    case GCSswpfinobj: {  /* sweep objects with finalizers */
      sweepstep(L, g, GCSswptobefnz, &g->tobefnz, fast);
      stepresult = GCSWEEPMAX;
      break;
    }
    case GCSswptobefnz: {  /* sweep objects to be finalized */
      sweepstep(L, g, GCSswpend, NULL, fast);
      stepresult = GCSWEEPMAX;
      break;
    }
    case GCSswpend: {  /* finish sweeps */
      checkSizes(L, g);
      g->gcstate = GCScallfin;
      stepresult = GCSWEEPMAX;
      break;
    }
    case GCScallfin: {  /* call finalizers */
      if (g->tobefnz && !g->gcemergency) {
        g->gcstopem = 0;  /* ok collections during finalizers */
        GCTM(L);  /* call one finalizer */
        stepresult = CWUFIN;
      }
      else {  /* emergency mode or no more finalizers */
        g->gcstate = GCSpause;  /* finish collection */
        stepresult = step2pause;
      }
      break;
    }
    default: lua_assert(0); return 0;
  }
  g->gcstopem = 0;
  return stepresult;
}